

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t mime_subparts_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  mime_state *state;
  curl_mimepart *pcVar1;
  char *__s;
  size_t sVar2;
  size_t numbytes;
  size_t sVar3;
  char *trail;
  
  state = (mime_state *)((long)instream + 0x28);
  sVar3 = 0;
  for (; nitems != 0; nitems = nitems - sVar2) {
    sVar2 = 0;
    if (state->state < MIMESTATE_LAST) {
      pcVar1 = *(curl_mimepart **)((long)instream + 0x30);
      switch(state->state) {
      case MIMESTATE_BEGIN:
      case MIMESTATE_BODY:
        *(undefined4 *)((long)instream + 0x28) = 5;
        *(undefined8 *)((long)instream + 0x30) = *(undefined8 *)((long)instream + 0x10);
        *(undefined8 *)((long)instream + 0x38) = 2;
LAB_0013a5ad:
        sVar2 = 0;
        break;
      case MIMESTATE_BOUNDARY1:
        sVar2 = readback_bytes(state,buffer,nitems,"\r\n--",4,"");
        if (sVar2 == 0) {
          *(undefined4 *)((long)instream + 0x28) = 6;
          *(curl_mimepart **)((long)instream + 0x30) = pcVar1;
LAB_0013a6b3:
          *(undefined8 *)((long)instream + 0x38) = 0;
          sVar2 = 0;
        }
        break;
      case MIMESTATE_BOUNDARY2:
        __s = *(char **)((long)instream + 0x20);
        numbytes = strlen(__s);
        trail = "\r\n";
        if (pcVar1 == (curl_mimepart *)0x0) {
          trail = "--\r\n";
        }
        sVar2 = readback_bytes(state,buffer,nitems,__s,numbytes,trail);
        if (sVar2 == 0) {
          *(undefined4 *)((long)instream + 0x28) = 7;
          *(curl_mimepart **)((long)instream + 0x30) = pcVar1;
          *(undefined8 *)((long)instream + 0x38) = 0;
          sVar2 = 0;
        }
        break;
      case MIMESTATE_CONTENT:
        if (pcVar1 == (curl_mimepart *)0x0) {
          state->state = MIMESTATE_END;
          *(undefined8 *)((long)instream + 0x30) = 0;
          *(undefined8 *)((long)instream + 0x38) = 0;
          goto LAB_0013a5ad;
        }
        sVar2 = readback_part(pcVar1,buffer,nitems);
        if (sVar2 == 0) {
          pcVar1 = pcVar1->nextpart;
          *(undefined4 *)((long)instream + 0x28) = 5;
          *(curl_mimepart **)((long)instream + 0x30) = pcVar1;
          goto LAB_0013a6b3;
        }
        if ((sVar2 - 0x10000000 < 2) || (sVar2 == 0xffffffffffffffff)) {
          if (sVar3 != 0) {
            return sVar3;
          }
          return sVar2;
        }
        break;
      case MIMESTATE_END:
        goto switchD_0013a593_caseD_8;
      }
    }
    sVar3 = sVar3 + sVar2;
    buffer = buffer + sVar2;
  }
switchD_0013a593_caseD_8:
  return sVar3;
}

Assistant:

static size_t mime_subparts_read(char *buffer, size_t size, size_t nitems,
                                 void *instream)
{
  curl_mime *mime = (curl_mime *) instream;
  size_t cursize = 0;
  size_t sz;
  curl_mimepart *part;
#ifdef CURL_DOES_CONVERSIONS
  char *convbuf = buffer;
#endif

  (void) size;   /* Always 1. */

  while(nitems) {
    sz = 0;
    part = mime->state.ptr;
    switch(mime->state.state) {
    case MIMESTATE_BEGIN:
    case MIMESTATE_BODY:
#ifdef CURL_DOES_CONVERSIONS
      convbuf = buffer;
#endif
      mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, mime->firstpart);
      /* The first boundary always follows the header termination empty line,
         so is always preceded by a CRLK. We can then spare 2 characters
         by skipping the leading CRLF in boundary. */
      mime->state.offset += 2;
      break;
    case MIMESTATE_BOUNDARY1:
      sz = readback_bytes(&mime->state, buffer, nitems, "\r\n--", 4, "");
      if(!sz)
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY2, part);
      break;
    case MIMESTATE_BOUNDARY2:
      sz = readback_bytes(&mime->state, buffer, nitems, mime->boundary,
                          strlen(mime->boundary), part? "\r\n": "--\r\n");
      if(!sz) {
#ifdef CURL_DOES_CONVERSIONS
        if(mime->easy && convbuf < buffer) {
          CURLcode result = Curl_convert_to_network(mime->easy, convbuf,
                                                    buffer - convbuf);
          if(result)
            return READ_ERROR;
          convbuf = buffer;
        }
#endif
        mimesetstate(&mime->state, MIMESTATE_CONTENT, part);
      }
      break;
    case MIMESTATE_CONTENT:
      if(!part) {
        mimesetstate(&mime->state, MIMESTATE_END, NULL);
        break;
      }
      sz = readback_part(part, buffer, nitems);
      switch(sz) {
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
        return cursize? cursize: sz;
      case 0:
#ifdef CURL_DOES_CONVERSIONS
        convbuf = buffer;
#endif
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, part->nextpart);
        break;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* other values not used in mime state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    nitems -= sz;
  }

#ifdef CURL_DOES_CONVERSIONS
      if(mime->easy && convbuf < buffer &&
         mime->state.state <= MIMESTATE_CONTENT) {
        CURLcode result = Curl_convert_to_network(mime->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
      }
#endif

  return cursize;
}